

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O0

ZCC_OpProto * __thiscall
ZCCCompiler::PromoteBinary
          (ZCCCompiler *this,EZCCExprType op,ZCC_Expression **left,ZCC_Expression **right)

{
  ZCC_Expression *pZVar1;
  ZCC_OpProto *proto;
  int route2len;
  int route1len;
  Conversion *route2 [8];
  Conversion *route1 [8];
  ZCC_Expression **right_local;
  ZCC_Expression **left_local;
  EZCCExprType op_local;
  ZCCCompiler *this_local;
  
  if (((*left)->Type == &TypeError->super_PType) || ((*right)->Type == &TypeError->super_PType)) {
    this_local = (ZCCCompiler *)0x0;
  }
  else {
    proto._4_4_ = 8;
    proto._0_4_ = 8;
    this_local = (ZCCCompiler *)
                 ZCC_OpInfoType::FindBestProto
                           (ZCC_OpInfo + op,(*left)->Type,route2 + 7,(int *)((long)&proto + 4),
                            (*right)->Type,(Conversion **)&route2len,(int *)&proto);
    if (this_local != (ZCCCompiler *)0x0) {
      pZVar1 = ApplyConversion(this,*left,route2 + 7,proto._4_4_);
      *left = pZVar1;
      pZVar1 = ApplyConversion(this,*right,(Conversion **)&route2len,(int)proto);
      *right = pZVar1;
    }
  }
  return (ZCC_OpProto *)this_local;
}

Assistant:

ZCC_OpProto *ZCCCompiler::PromoteBinary(EZCCExprType op, ZCC_Expression *&left, ZCC_Expression *&right)
{
	// If either operand is of type 'error', the result is also 'error'
	if (left->Type == TypeError || right->Type == TypeError)
	{
		return NULL;
	}
	const PType::Conversion *route1[CONVERSION_ROUTE_SIZE], *route2[CONVERSION_ROUTE_SIZE];
	int route1len = countof(route1), route2len = countof(route2);
	ZCC_OpProto *proto = ZCC_OpInfo[op].FindBestProto(left->Type, route1, route1len, right->Type, route2, route2len);
	if (proto != NULL)
	{
		left = ApplyConversion(left, route1, route1len);
		right = ApplyConversion(right, route2, route2len);
	}
	return proto;
}